

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O0

double fmin(double __x,double __y)

{
  bool bVar1;
  ExactFloat *in_RDX;
  ExactFloat *in_RSI;
  ExactFloat *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar2;
  ExactFloat *local_40;
  ExactFloat *local_38;
  ExactFloat *b_local;
  ExactFloat *a_local;
  
  bVar1 = ExactFloat::is_nan(in_RSI);
  if (bVar1) {
    ExactFloat::ExactFloat(in_RDI,in_RDX);
    dVar2 = extraout_XMM0_Qa;
  }
  else {
    bVar1 = ExactFloat::is_nan(in_RDX);
    if (bVar1) {
      ExactFloat::ExactFloat(in_RDI,in_RSI);
      dVar2 = extraout_XMM0_Qa_00;
    }
    else if (in_RSI->sign_ == in_RDX->sign_) {
      bVar1 = operator<(in_RSI,in_RDX);
      local_40 = in_RSI;
      if (!bVar1) {
        local_40 = in_RDX;
      }
      ExactFloat::ExactFloat(in_RDI,local_40);
      dVar2 = extraout_XMM0_Qa_02;
    }
    else {
      local_38 = in_RDX;
      if (in_RSI->sign_ < in_RDX->sign_) {
        local_38 = in_RSI;
      }
      ExactFloat::ExactFloat(in_RDI,local_38);
      dVar2 = extraout_XMM0_Qa_01;
    }
  }
  return dVar2;
}

Assistant:

ExactFloat fmin(const ExactFloat& a, const ExactFloat& b) {
  // If one argument is NaN, return the other argument.
  if (a.is_nan()) return b;
  if (b.is_nan()) return a;
  // Not required by IEEE 754, but we prefer -0 over +0.
  if (a.sign_ != b.sign_) {
    return (a.sign_ < b.sign_) ? a : b;
  }
  return (a < b) ? a : b;
}